

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall
QXmlStreamWriterPrivate::writeNamespaceDeclaration
          (QXmlStreamWriterPrivate *this,NamespaceDeclaration *namespaceDeclaration)

{
  QString *pQVar1;
  char16_t *in_RCX;
  char16_t *__n;
  void *pvVar2;
  int iVar3;
  
  if ((namespaceDeclaration->prefix).m_size == 0) {
    iVar3 = 0x58e263;
    pvVar2 = (void *)0x8;
  }
  else {
    write(this,0x58e26c,&DAT_00000007,(size_t)in_RCX);
    pQVar1 = (namespaceDeclaration->prefix).m_string;
    if (pQVar1 == (QString *)0x0) {
      iVar3 = 0;
    }
    else {
      in_RCX = (pQVar1->d).ptr;
      if (in_RCX == (char16_t *)0x0) {
        in_RCX = L"";
      }
      iVar3 = (int)in_RCX + (int)(namespaceDeclaration->prefix).m_pos * 2;
    }
    pvVar2 = (void *)((namespaceDeclaration->prefix).m_size | 0x8000000000000000);
    if (pQVar1 == (QString *)0x0) {
      pvVar2 = (void *)0x8000000000000000;
    }
    write(this,iVar3,pvVar2,(size_t)in_RCX);
    iVar3 = 0x4dd42f;
    pvVar2 = (void *)0x2;
  }
  write(this,iVar3,pvVar2,(size_t)in_RCX);
  pQVar1 = (namespaceDeclaration->namespaceUri).m_string;
  if (pQVar1 == (QString *)0x0) {
    iVar3 = 0;
    __n = (char16_t *)0x0;
  }
  else {
    __n = (pQVar1->d).ptr;
    if (__n == (char16_t *)0x0) {
      __n = L"";
    }
    iVar3 = (int)__n + (int)(namespaceDeclaration->namespaceUri).m_pos * 2;
  }
  pvVar2 = (void *)((namespaceDeclaration->namespaceUri).m_size | 0x8000000000000000);
  if (pQVar1 == (QString *)0x0) {
    pvVar2 = (void *)0x8000000000000000;
  }
  write(this,iVar3,pvVar2,(size_t)__n);
  write(this,0x4dbb8f,(void *)0x1,(size_t)__n);
  this->field_0x79 = this->field_0x79 | 2;
  return;
}

Assistant:

void QXmlStreamWriterPrivate::writeNamespaceDeclaration(const NamespaceDeclaration &namespaceDeclaration) {
    if (namespaceDeclaration.prefix.isEmpty()) {
        write(" xmlns=\"");
        write(namespaceDeclaration.namespaceUri);
        write("\"");
    } else {
        write(" xmlns:");
        write(namespaceDeclaration.prefix);
        write("=\"");
        write(namespaceDeclaration.namespaceUri);
        write("\"");
    }
    didWriteAnyToken = true;
}